

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getsockname.c
# Opt level: O3

void on_connect(uv_connect_t *req,int status)

{
  int iVar1;
  uv_loop_t *loop;
  uv_loop_t *puVar2;
  
  if (status == 0) {
    uv_close((uv_handle_t *)req->handle,(uv_close_cb)0x0);
    return;
  }
  on_connect_cold_1();
  loop = uv_default_loop();
  puVar2 = loop;
  iVar1 = uv_tcp_init(loop,(uv_tcp_t *)&stack0xfffffffffffffef8);
  if (iVar1 == 0) {
    puVar2 = (uv_loop_t *)&stack0xfffffffffffffef8;
    iVar1 = uv_tcp_nodelay((uv_tcp_t *)puVar2,1);
    if (iVar1 != 0) goto LAB_0017040e;
    puVar2 = (uv_loop_t *)&stack0xfffffffffffffef8;
    iVar1 = uv_tcp_keepalive((uv_tcp_t *)puVar2,1,0x3c);
    if (iVar1 != 0) goto LAB_00170413;
    uv_close((uv_handle_t *)&stack0xfffffffffffffef8,(uv_close_cb)0x0);
    iVar1 = uv_run(loop,UV_RUN_DEFAULT);
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      loop = uv_default_loop();
      iVar1 = uv_loop_close(loop);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_0017041d;
    }
  }
  else {
    run_test_tcp_flags_cold_1();
LAB_0017040e:
    run_test_tcp_flags_cold_2();
LAB_00170413:
    loop = puVar2;
    run_test_tcp_flags_cold_3();
  }
  run_test_tcp_flags_cold_4();
LAB_0017041d:
  run_test_tcp_flags_cold_5();
  iVar1 = uv_is_closing((uv_handle_t *)loop);
  if (iVar1 != 0) {
    return;
  }
  uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
  return;
}

Assistant:

static void on_connect(uv_connect_t* req, int status) {
  struct sockaddr sockname, peername;
  int r, namelen;

  ASSERT(status == 0);

  namelen = sizeof sockname;
  r = uv_tcp_getsockname((uv_tcp_t*) req->handle, &sockname, &namelen);
  ASSERT(r == 0);
  check_sockname(&sockname, "127.0.0.1", 0, "connected socket");
  getsocknamecount++;

  namelen = sizeof peername;
  r = uv_tcp_getpeername((uv_tcp_t*) req->handle, &peername, &namelen);
  ASSERT(r == 0);
  check_sockname(&peername, "127.0.0.1", server_port, "connected socket peer");
  getpeernamecount++;

  uv_close((uv_handle_t*)&tcp, NULL);
}